

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::custom_layer_to_index(Net *this,char *type)

{
  int iVar1;
  long lVar2;
  long lVar3;
  pointer pcVar4;
  
  pcVar4 = (this->d->custom_layer_registry).
           super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->d->custom_layer_registry).
                super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 5;
    lVar3 = 0;
    do {
      iVar1 = strcmp(type,pcVar4->name);
      if (iVar1 == 0) {
        return (int)lVar3;
      }
      lVar3 = lVar3 + 1;
      pcVar4 = pcVar4 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return -1;
}

Assistant:

int Net::custom_layer_to_index(const char* type)
{
    const size_t custom_layer_registry_entry_count = d->custom_layer_registry.size();
    for (size_t i = 0; i < custom_layer_registry_entry_count; i++)
    {
        if (strcmp(type, d->custom_layer_registry[i].name) == 0)
            return static_cast<int>(i);
    }

    return -1;
}